

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall Spaghetti<RemSP>::PerformLabeling(Spaghetti<RemSP> *this)

{
  char cVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int local_190;
  Mat local_90 [96];
  long lVar23;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar16 = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar17 = (ulong)(int)uVar2;
  cv::Mat::Mat(local_90,**(int **)&pMVar3->field_0x40,(*(int **)&pMVar3->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar46 = uVar16 & 0xfffffffe;
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar7 = (uint *)operator_new__((ulong)(((*(int *)&pMVar3->field_0xc -
                                           (*(int *)&pMVar3->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar3->field_0x8 -
                                           (*(int *)&pMVar3->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  RemSP::P_ = puVar7;
  *puVar7 = 0;
  RemSP::length_ = 1;
  lVar45 = *(long *)&pMVar3->field_0x10;
  if (uVar16 == 1) {
    lVar48 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar15 = 0;
    iVar14 = (int)(uVar17 - 2);
    if (2 < (int)uVar2) {
      uVar6 = 0xfffffffe;
      uVar15 = 0;
LAB_001515fd:
      if (*(char *)(lVar45 + (int)uVar15) == '\0') goto LAB_0015162d;
      cVar1 = *(char *)(lVar45 + 3 + (long)(int)uVar6);
      puVar7[RemSP::length_] = RemSP::length_;
      uVar6 = RemSP::length_ + 1;
      *(uint *)(lVar48 + (long)(int)uVar15 * 4) = RemSP::length_;
      RemSP::length_ = uVar6;
      uVar6 = uVar15;
      if (cVar1 == '\0') goto LAB_001516ac;
      while (uVar6 = uVar15 + 2, (int)uVar6 < iVar14) {
        uVar34 = (long)(int)uVar15;
        uVar15 = uVar6;
        while (*(char *)(lVar45 + 2 + uVar34) != '\0') {
          if (*(char *)(lVar45 + 3 + uVar34) == '\0') {
            uVar12 = *(undefined4 *)(lVar48 + uVar34 * 4);
            lVar38 = uVar34 + 2;
            goto LAB_001516a8;
          }
          *(undefined4 *)(lVar48 + 8 + uVar34 * 4) = *(undefined4 *)(lVar48 + uVar34 * 4);
          uVar35 = uVar34 + 2;
          lVar38 = uVar34 + 4;
          uVar15 = uVar15 + 2;
          uVar34 = uVar35;
          if ((long)(uVar17 - 2) <= lVar38) goto LAB_00151a23;
        }
LAB_0015162d:
        lVar38 = (long)(int)uVar15;
        if (*(char *)(lVar45 + 1 + lVar38) == '\0') goto LAB_00151693;
        puVar7[RemSP::length_] = RemSP::length_;
        uVar6 = RemSP::length_ + 1;
        *(uint *)(lVar48 + lVar38 * 4) = RemSP::length_;
        RemSP::length_ = uVar6;
      }
      uVar35 = (ulong)uVar15;
      uVar15 = uVar6;
LAB_00151a23:
      lVar38 = (long)(int)uVar15;
      if (iVar14 < (int)uVar15) {
        if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00151a36;
      }
      else if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00151a57;
      *(undefined4 *)(lVar48 + lVar38 * 4) = *(undefined4 *)(lVar48 + (long)(int)uVar35 * 4);
      goto LAB_00155fad;
    }
LAB_001516bb:
    lVar38 = (long)(int)uVar15;
    if (iVar14 < (int)uVar15) {
      if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_00151a36:
        *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
        goto LAB_00155fad;
      }
    }
    else if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_00151a57:
      lVar38 = (long)(int)uVar15;
      if (*(char *)(lVar45 + 1 + lVar38) == '\0') {
        *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
      }
      else {
        puVar7[RemSP::length_] = RemSP::length_;
        uVar15 = RemSP::length_ + 1;
        *(uint *)(lVar48 + lVar38 * 4) = RemSP::length_;
        RemSP::length_ = uVar15;
      }
      goto LAB_00155fad;
    }
    puVar7[RemSP::length_] = RemSP::length_;
    uVar15 = RemSP::length_ + 1;
    *(uint *)(lVar48 + lVar38 * 4) = RemSP::length_;
    RemSP::length_ = uVar15;
    goto LAB_00155fad;
  }
  lVar38 = **(long **)&pMVar3->field_0x48;
  lVar48 = lVar45 + lVar38;
  lVar37 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar34 = 0;
  local_190 = (int)(uVar17 - 2);
  if ((int)uVar2 < 3) {
LAB_001518f3:
    uVar15 = (uint)uVar34;
    lVar38 = (long)(int)uVar15;
    if ((int)uVar15 <= local_190) {
      if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0')) {
LAB_00151a9d:
        lVar38 = (long)(int)uVar34;
        if (*(char *)(lVar38 + 1 + lVar45) == '\0') {
          if (*(char *)(lVar48 + 1 + lVar38) == '\0') {
            *(undefined4 *)(lVar37 + lVar38 * 4) = 0;
          }
          else {
            puVar7[RemSP::length_] = RemSP::length_;
            uVar15 = RemSP::length_ + 1;
            *(uint *)(lVar37 + lVar38 * 4) = RemSP::length_;
            RemSP::length_ = uVar15;
          }
        }
        else {
          puVar7[RemSP::length_] = RemSP::length_;
          uVar15 = RemSP::length_ + 1;
          *(uint *)(lVar37 + lVar38 * 4) = RemSP::length_;
          RemSP::length_ = uVar15;
        }
      }
      else {
LAB_0015199d:
        puVar7[RemSP::length_] = RemSP::length_;
        uVar6 = RemSP::length_ + 1;
        *(uint *)(lVar37 + (long)(int)uVar15 * 4) = RemSP::length_;
        RemSP::length_ = uVar6;
      }
      goto LAB_00151ac4;
    }
    if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0'))
    goto LAB_00151949;
LAB_001519da:
    puVar7[RemSP::length_] = RemSP::length_;
    uVar15 = RemSP::length_ + 1;
    *(uint *)(lVar37 + lVar38 * 4) = RemSP::length_;
    RemSP::length_ = uVar15;
  }
  else {
    uVar34 = 0;
LAB_00151720:
    if ((*(char *)(lVar45 + (int)uVar34) == '\0') && (*(char *)(lVar48 + (int)uVar34) == '\0'))
    goto LAB_00151744;
LAB_001518a3:
    cVar1 = *(char *)(lVar45 + 1 + (long)(int)uVar34);
    puVar7[RemSP::length_] = RemSP::length_;
    uVar15 = RemSP::length_ + 1;
    *(uint *)(lVar37 + (long)(int)uVar34 * 4) = RemSP::length_;
    RemSP::length_ = uVar15;
    if (cVar1 != '\0') goto LAB_0015178c;
LAB_001517bc:
    iVar14 = (int)uVar34;
    uVar15 = iVar14 + 2;
    if ((int)uVar15 < local_190) {
      lVar40 = (long)iVar14;
      lVar24 = lVar40 + 2;
      lVar11 = lVar37 + lVar40 * 4;
      lVar49 = lVar45 + lVar38 + 2 + lVar40;
      lVar33 = lVar45 + 2 + lVar40;
      lVar40 = lVar40 << 0x20;
      lVar43 = 0;
      while( true ) {
        if (*(char *)(lVar33 + lVar43) != '\0') {
          uVar34 = lVar24 + lVar43 & 0xffffffff;
          if (*(char *)(lVar48 + 1 + (lVar40 >> 0x20)) != '\0') goto LAB_001517a8;
          goto LAB_001518a3;
        }
        if (*(char *)(lVar49 + lVar43) == '\0') {
          uVar34 = (ulong)(uint)((int)lVar24 + (int)lVar43);
          goto LAB_00151744;
        }
        if (*(char *)(lVar33 + 1 + lVar43) != '\0') break;
        if (*(char *)(lVar49 + -1 + lVar43) == '\0') {
          puVar7[RemSP::length_] = RemSP::length_;
          uVar15 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
        }
        else {
          uVar15 = *(uint *)(lVar11 + lVar43 * 4);
        }
        *(uint *)(lVar11 + 8 + lVar43 * 4) = uVar15;
        lVar40 = lVar40 + 0x200000000;
        lVar36 = lVar24 + lVar43;
        lVar43 = lVar43 + 2;
        if ((long)(uVar17 - 2) <= lVar36 + 2) {
          uVar15 = iVar14 + (int)lVar43 + 2;
          iVar14 = iVar14 + (int)lVar43;
          goto LAB_0015192c;
        }
      }
      uVar35 = lVar24 + lVar43;
      if (*(char *)(lVar43 + -1 + lVar49) == '\0') {
        uVar32 = (ulong)RemSP::length_;
        puVar7[uVar32] = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
      }
      else {
        uVar32 = (ulong)*(uint *)(lVar11 + lVar43 * 4);
      }
      uVar34 = uVar35 & 0xffffffff;
      while( true ) {
        *(int *)(lVar37 + uVar35 * 4) = (int)uVar32;
LAB_0015178c:
        while( true ) {
          lVar24 = (long)(int)uVar34;
          uVar34 = lVar24 + 2;
          if (local_190 <= (int)uVar34) {
            if (local_190 < (int)uVar34) {
              if (*(char *)(lVar45 + uVar34) == '\0') {
                if (*(char *)(lVar48 + uVar34) == '\0') {
                  *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = 0;
                }
                else {
                  *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = *(undefined4 *)(lVar37 + lVar24 * 4);
                }
              }
              else {
                *(undefined4 *)(lVar37 + 8 + lVar24 * 4) = *(undefined4 *)(lVar37 + lVar24 * 4);
              }
              goto LAB_00151ac4;
            }
            if ((*(char *)(lVar45 + uVar34) != '\0') || (*(char *)(lVar48 + uVar34) != '\0'))
            goto LAB_00151a91;
            goto LAB_00151a9d;
          }
          if ((*(char *)(lVar45 + uVar34) == '\0') && (*(char *)(lVar48 + uVar34) == '\0')) break;
LAB_001517a8:
          lVar24 = (long)(int)uVar34;
          cVar1 = *(char *)(lVar45 + 1 + lVar24);
          *(undefined4 *)(lVar37 + lVar24 * 4) = *(undefined4 *)(lVar37 + -8 + lVar24 * 4);
          if (cVar1 == '\0') goto LAB_001517bc;
        }
LAB_00151744:
        iVar14 = (int)uVar34;
        uVar35 = (ulong)iVar14;
        if ((*(char *)(uVar35 + 1 + lVar45) == '\0') && (*(char *)(lVar48 + 1 + uVar35) == '\0'))
        break;
        uVar32 = (ulong)RemSP::length_;
        puVar7[uVar32] = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
      }
      *(undefined4 *)(lVar37 + (long)iVar14 * 4) = 0;
      uVar34 = (ulong)(iVar14 + 2U);
      if (local_190 <= (int)(iVar14 + 2U)) goto LAB_001518f3;
      goto LAB_00151720;
    }
LAB_0015192c:
    uVar34 = (ulong)uVar15;
    lVar38 = (long)(int)uVar15;
    if (local_190 < (int)uVar15) {
      if ((*(char *)(lVar45 + lVar38) == '\0') && (*(char *)(lVar48 + lVar38) == '\0')) {
LAB_00151949:
        *(undefined4 *)(lVar37 + lVar38 * 4) = 0;
      }
      else {
LAB_001519c4:
        if (*(char *)(lVar48 + 1 + (long)iVar14) == '\0') goto LAB_001519da;
        *(undefined4 *)(lVar37 + lVar38 * 4) = *(undefined4 *)(lVar37 + (long)iVar14 * 4);
      }
    }
    else {
      if (*(char *)(lVar45 + lVar38) == '\0') {
        if (*(char *)(lVar48 + lVar38) == '\0') goto LAB_00151a9d;
        goto LAB_001519c4;
      }
      if (*(char *)(lVar48 + 1 + (long)iVar14) == '\0') goto LAB_0015199d;
LAB_00151a91:
      *(undefined4 *)(lVar37 + (long)(int)uVar34 * 4) =
           *(undefined4 *)(lVar37 + -8 + (long)(int)uVar34 * 4);
    }
  }
LAB_00151ac4:
  if (2 < (int)uVar46) {
    lVar45 = (long)local_190;
    uVar34 = 2;
    lVar37 = 1;
    lVar48 = 3;
    lVar38 = 0;
    do {
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar49 = *(long *)&pMVar3->field_0x10;
      lVar33 = **(long **)&pMVar3->field_0x48;
      lVar47 = lVar33 * uVar34;
      lVar24 = lVar49 + lVar47;
      lVar31 = lVar24 - lVar33;
      lVar11 = lVar24 + lVar33;
      lVar43 = *(long *)&pMVar4->field_0x10;
      lVar40 = **(long **)&pMVar4->field_0x48;
      lVar36 = lVar40 * uVar34;
      lVar30 = lVar43 + lVar36;
      lVar27 = lVar30 + lVar40 * -2;
      cVar1 = *(char *)(lVar49 + lVar47);
      if (2 < (int)uVar2) {
        lVar18 = lVar31 - lVar33;
        uVar35 = 0;
        uVar32 = 0;
        if (cVar1 == '\0') goto LAB_00151cc9;
LAB_00151beb:
        uVar35 = uVar32;
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar29 + 1 + lVar31) == '\0') {
          uVar32 = uVar35;
          if (*(char *)(lVar24 + 1 + lVar29) != '\0') goto LAB_00151d6f;
          if (*(char *)(lVar31 + lVar29) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar15 = RemSP::length_ + 1;
            *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
            RemSP::length_ = uVar15;
            goto LAB_0015236c;
          }
          *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
          goto LAB_00152dca;
        }
        *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
LAB_001544fe:
        iVar14 = (int)uVar35;
        uVar15 = iVar14 + 2;
        if ((int)uVar15 < local_190) {
          lVar20 = (long)iVar14;
          lVar29 = lVar20 + 2;
          lVar42 = lVar33 * lVar48 + lVar20;
          lVar39 = lVar33 * lVar37 + lVar20;
          lVar25 = lVar36 + lVar20 * 4;
          lVar26 = lVar40 * lVar38 + lVar20 * 4;
          lVar21 = lVar20 << 0x20;
          lVar8 = lVar49 + lVar47 + lVar20;
          lVar9 = lVar49 + 2 + lVar39;
          lVar28 = lVar25 + lVar43 + 8;
          lVar44 = lVar43 + lVar26 + 8;
          lVar10 = 0;
          while( true ) {
            lVar22 = lVar21 >> 0x1e;
            lVar23 = lVar21 >> 0x20;
            if (*(char *)(lVar8 + 2 + lVar10) == '\0') break;
            iVar41 = (int)lVar29;
            if ((*(char *)(lVar8 + 1 + lVar10) != '\0') ||
               (*(char *)(lVar49 + lVar42 + 1 + lVar10) != '\0')) {
              uVar35 = (ulong)(uint)(iVar41 + (int)lVar10);
              goto LAB_00153d2a;
            }
            if (*(char *)(lVar9 + 1 + lVar10) == '\0') {
              uVar35 = lVar29 + lVar10;
              if (*(char *)(lVar10 + 3 + lVar47 + lVar20 + lVar49) == '\0') {
                if (*(char *)(lVar10 + 2 + lVar39 + lVar49) == '\0') {
                  *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) =
                       *(undefined4 *)(lVar27 + lVar22);
                  uVar35 = uVar35 & 0xffffffff;
                  goto LAB_0015236c;
                }
                *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar44 + lVar10 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00152dca;
              }
              cVar1 = *(char *)(lVar10 + 2 + lVar39 + lVar49);
              if (*(char *)(lVar31 + 4 + lVar23) != '\0') {
                if (cVar1 == '\0') goto LAB_00154cac;
                goto LAB_00151d89;
              }
              if (cVar1 != '\0') {
                *(undefined4 *)(lVar28 + lVar10 * 4) =
                     *(undefined4 *)(lVar26 + lVar43 + 8 + lVar10 * 4);
                goto LAB_00154bcb;
              }
              *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar27 + lVar23 * 4);
              goto LAB_00154dba;
            }
            if (*(char *)(lVar9 + lVar10) == '\0') {
              uVar35 = (ulong)(uint)(iVar41 + (int)lVar10);
LAB_0015491e:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar18 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                      *(uint *)(lVar27 + lVar29 * 4));
              }
              else {
LAB_0015492c:
                uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              }
              goto LAB_00154973;
            }
            *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar44 + lVar10 * 4);
            lVar21 = lVar21 + 0x200000000;
            lVar23 = lVar29 + lVar10;
            lVar10 = lVar10 + 2;
            if (lVar45 <= lVar23 + 2) {
              iVar14 = iVar14 + (int)lVar10;
              uVar15 = iVar41 + (int)lVar10;
              goto LAB_00154639;
            }
          }
          uVar35 = lVar29 + lVar10;
          if (*(char *)(lVar10 + 2 + lVar42 + lVar49) == '\0') goto LAB_00151d40;
          lVar8 = lVar21 + 0x300000000 >> 0x20;
          lVar9 = lVar21 + 0x100000000 >> 0x20;
          if (*(char *)(lVar24 + lVar8) == '\0') {
            if (*(char *)(lVar11 + lVar9) != '\0') {
              *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar22);
              goto LAB_0015266a;
            }
            if (*(char *)(lVar24 + lVar9) != '\0') {
              *(undefined4 *)(lVar25 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar22);
              goto LAB_0015266a;
            }
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar15 = RemSP::length_ + 1;
            *(uint *)(lVar25 + lVar43 + 8 + lVar10 * 4) = RemSP::length_;
            RemSP::length_ = uVar15;
            goto LAB_0015266a;
          }
          if (*(char *)(lVar24 + lVar9) != '\0') goto LAB_00154853;
          if (*(char *)(lVar11 + lVar9) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_00151d51;
          }
          if (*(char *)(lVar31 + lVar8) != '\0') {
            uVar32 = uVar35 & 0xffffffff;
            goto LAB_00154864;
          }
          if (*(char *)(lVar31 + 4 + lVar23) != '\0') goto LAB_00153d7e;
          if (*(char *)(lVar10 + 2 + lVar39 + lVar49) == '\0') {
            *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar23 * 4);
LAB_00154dba:
            uVar35 = lVar29 + lVar10;
            goto LAB_00152f85;
          }
          *(undefined4 *)(lVar28 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar43 + 8 + lVar10 * 4);
LAB_00154bcb:
          uVar35 = lVar29 + lVar10;
LAB_00151db9:
          lVar29 = (long)(int)uVar35;
          uVar35 = lVar29 + 2;
          if ((int)uVar35 < local_190) {
            if (*(char *)(lVar24 + uVar35) == '\0') {
              if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0015315a;
              if (*(char *)(lVar29 + 3 + lVar24) == '\0') {
LAB_0015313f:
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0015266a;
              }
              if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
                if (*(char *)(lVar18 + uVar35) == '\0') {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                        *(uint *)(lVar30 + lVar29 * 4));
                  *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                  goto LAB_00153c89;
                }
LAB_00153a3a:
                lVar29 = (long)(int)uVar35;
                uVar15 = *(uint *)(lVar27 + lVar29 * 4);
                if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
                  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                  goto LAB_00153c89;
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                goto LAB_00153c89;
              }
LAB_00151ef5:
              if (*(char *)(lVar29 + 4 + lVar31) == '\0') {
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00153624;
              }
              if (*(char *)(lVar18 + 3 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                      *(uint *)(lVar30 + lVar29 * 4));
                *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
              }
              else {
                uVar32 = uVar35;
                if (*(char *)(lVar18 + uVar35) != '\0') goto LAB_0015381d;
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                      *(uint *)(lVar30 + lVar29 * 4));
                *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
LAB_0015320c:
              iVar14 = (int)uVar35;
              uVar15 = iVar14 + 2;
              if ((int)uVar15 < local_190) {
                lVar21 = (long)iVar14;
                lVar28 = lVar21 << 0x20;
                lVar25 = lVar49 + 3 + lVar47 + lVar21;
                lVar26 = lVar33 * lVar37 + lVar21 + lVar49;
                lVar8 = lVar40 * lVar38 + lVar21 * 4 + lVar43;
                lVar9 = lVar8 + 8;
                lVar29 = lVar36 + lVar21 * 4;
                lVar20 = lVar43 + lVar29 + 8;
                lVar10 = 0;
                do {
                  lVar39 = lVar28 >> 0x1e;
                  iVar41 = (int)lVar10;
                  iVar13 = (int)(lVar21 + 2);
                  if (*(char *)(lVar25 + -1 + lVar10) == '\0') {
                    if (*(char *)(lVar33 * lVar48 + lVar21 + lVar49 + 2 + lVar10) != '\0') {
                      if (*(char *)(lVar25 + lVar10) == '\0') {
                        uVar35 = (ulong)(uint)(iVar13 + iVar41);
                        *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) =
                             *(undefined4 *)(lVar30 + lVar39);
                        goto LAB_0015266a;
                      }
                      if (*(char *)(lVar26 + 3 + lVar10) != '\0') {
                        uVar35 = (ulong)(uint)(iVar13 + iVar41);
                        *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                        goto LAB_00153c89;
                      }
                      goto LAB_00153383;
                    }
                    uVar35 = lVar21 + 2 + lVar10;
                    lVar29 = lVar28 + 0x300000000 >> 0x20;
                    if (*(char *)(lVar24 + lVar29) == '\0') {
                      iVar14 = (int)uVar35;
                      goto LAB_00152050;
                    }
                    if (*(char *)(lVar31 + lVar29) != '\0') {
                      *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                      goto LAB_00153c89;
                    }
                    if (*(char *)(lVar31 + 4 + (lVar28 >> 0x20)) != '\0') {
                      uVar35 = uVar35 & 0xffffffff;
LAB_00151d89:
                      lVar29 = (long)(int)uVar35;
                      if (*(char *)(lVar18 + 1 + lVar29) != '\0') goto LAB_00151d9c;
                      uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                            *(uint *)(lVar27 + 8 + lVar29 * 4));
                      goto LAB_0015415b;
                    }
                    *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                    uVar35 = uVar35 & 0xffffffff;
                    goto LAB_00151db9;
                  }
                  if (*(char *)(lVar26 + 3 + lVar10) != '\0') {
                    uVar35 = (ulong)(uint)(iVar13 + iVar41);
                    *(undefined4 *)(lVar20 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
                    goto LAB_001544fe;
                  }
                  if (*(char *)(lVar25 + lVar10) == '\0') {
                    uVar15 = iVar13 + iVar41;
                    *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) =
                         *(undefined4 *)(lVar30 + lVar39);
                    goto LAB_001538c8;
                  }
LAB_00153383:
                  if (*(char *)(lVar26 + 4 + lVar10) == '\0') goto LAB_00153494;
                  uVar15 = *(uint *)(lVar8 + 0x10 + lVar10 * 4);
                  if (*(char *)(lVar33 * lVar38 + lVar21 + lVar49 + 3 + lVar10) == '\0') {
                    uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar43 + lVar29 + lVar10 * 4));
                  }
                  *(uint *)(lVar20 + lVar10 * 4) = uVar15;
                  lVar28 = lVar28 + 0x200000000;
                  lVar39 = lVar21 + lVar10;
                  lVar10 = lVar10 + 2;
                  if (lVar45 <= lVar39 + 4) {
                    iVar14 = iVar14 + (int)lVar10;
                    uVar15 = iVar13 + (int)lVar10;
                    break;
                  }
                } while( true );
              }
              uVar32 = (ulong)uVar15;
              if (local_190 < (int)uVar15) goto LAB_00153cc9;
              lVar49 = (long)iVar14;
              if (*(char *)(lVar24 + uVar32) == '\0') {
                cVar1 = *(char *)(lVar24 + 3 + lVar49);
                if (*(char *)(lVar11 + uVar32) == '\0') {
                  if (cVar1 == '\0') goto LAB_001549a0;
                  uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
                  goto LAB_00153976;
                }
                if (cVar1 != '\0') goto LAB_00153463;
LAB_00153487:
                uVar12 = *(undefined4 *)(lVar30 + lVar49 * 4);
              }
              else {
LAB_00153463:
                if (*(char *)(lVar31 + 3 + lVar49) == '\0') goto LAB_00153487;
                uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
              }
LAB_0015348b:
              *(undefined4 *)(lVar30 + uVar32 * 4) = uVar12;
              goto LAB_001546c8;
            }
            if (*(char *)(lVar29 + 3 + lVar31) == '\0') {
              if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
                *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00153dcd;
              }
              goto LAB_00151ef5;
            }
            if (*(char *)(lVar18 + uVar35) == '\0') {
LAB_0015239e:
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                    *(uint *)(lVar30 + lVar29 * 4));
              *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
            }
            else {
LAB_00151dee:
              lVar29 = (long)(int)uVar35;
              uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
LAB_00153e24:
                uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
LAB_00154973:
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            goto LAB_001544fe;
          }
          uVar32 = uVar35;
          if (local_190 < (int)uVar35) {
LAB_00153cc9:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar24 + uVar35) != '\0') goto LAB_001546ba;
LAB_00153cd6:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0015474e;
            goto LAB_001546ba;
          }
          uVar32 = uVar35 & 0xffffffff;
          if (*(char *)(lVar24 + uVar32) == '\0') {
            if (*(char *)(lVar11 + uVar32) == '\0') {
LAB_0015394d:
              uVar15 = (uint)uVar35;
              uVar32 = (ulong)(int)uVar15;
              if (*(char *)(uVar32 + 1 + lVar24) == '\0') goto LAB_001549a0;
              if (*(char *)(lVar31 + 1 + uVar32) == '\0') goto LAB_001549aa;
              uVar12 = *(undefined4 *)(lVar27 + uVar32 * 4);
LAB_00153976:
              *(undefined4 *)(lVar30 + uVar32 * 4) = uVar12;
              goto LAB_001546c8;
            }
            if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_00151e24;
          }
          else {
LAB_00151e24:
            if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
              uVar19 = uVar35;
              if (*(char *)(lVar18 + uVar32) == '\0') {
LAB_00153021:
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + uVar32 * 4),*(uint *)(lVar30 + lVar29 * 4))
                ;
                *(uint *)(lVar30 + uVar32 * 4) = uVar15;
              }
              else {
LAB_00153fc5:
                lVar24 = (long)(int)uVar19;
                uVar15 = *(uint *)(lVar27 + lVar24 * 4);
                if (*(char *)(lVar18 + -1 + lVar24) == '\0') {
                  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar24 * 4));
                  *(uint *)(lVar30 + lVar24 * 4) = uVar15;
                }
                else {
                  *(uint *)(lVar30 + lVar24 * 4) = uVar15;
                }
              }
              goto LAB_001546c8;
            }
          }
LAB_00153fe5:
          *(undefined4 *)(lVar30 + uVar32 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
          goto LAB_001546c8;
        }
LAB_00154639:
        uVar35 = (ulong)uVar15;
        if (local_190 < (int)uVar15) {
          if (*(char *)(lVar24 + uVar35) == '\0') {
            if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0015474e;
LAB_0015479a:
            if ((*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0') &&
               (*(char *)(lVar24 + (ulong)(iVar14 + 1)) == '\0')) goto LAB_00152156;
          }
          else if ((*(char *)(lVar24 + (ulong)(iVar14 + 1)) == '\0') &&
                  (*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0')) {
LAB_00154b2e:
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_00151c5d;
            uVar12 = *(undefined4 *)(lVar27 + (long)iVar14 * 4);
            goto LAB_001546bf;
          }
LAB_001547b3:
          uVar12 = *(undefined4 *)(lVar30 + (long)iVar14 * 4);
          goto LAB_001546bf;
        }
        if (*(char *)(lVar24 + uVar35) == '\0') {
          if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_00154981:
            uVar15 = (uint)uVar35;
            goto LAB_00154987;
          }
          if (*(char *)(lVar24 + (ulong)(iVar14 + 3)) == '\0') goto LAB_0015479a;
          if (*(char *)(lVar24 + (ulong)(iVar14 + 1)) != '\0') goto LAB_0015469e;
          if (*(char *)(lVar11 + (ulong)(iVar14 + 1)) == '\0') goto LAB_00151ba4;
          if (*(char *)(lVar31 + (ulong)(iVar14 + 3)) == '\0') {
            if (*(char *)(lVar31 + uVar35) == '\0') goto LAB_001547b3;
            goto LAB_00151c5d;
          }
LAB_001546a8:
          uVar35 = (ulong)(int)uVar15;
          if (*(char *)(lVar31 + uVar35) == '\0') {
            uVar15 = *(uint *)(lVar27 + uVar35 * 4);
            if (*(char *)(lVar18 + uVar35) == '\0') {
              uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + uVar35 * 4));
              *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            }
            else {
              *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            }
            goto LAB_001546c8;
          }
        }
        else {
          if ((*(char *)(lVar24 + (ulong)(iVar14 + 1)) != '\0') ||
             (*(char *)(lVar11 + (ulong)(iVar14 + 1)) != '\0')) {
LAB_0015469e:
            uVar15 = (uint)uVar35;
            uVar35 = (ulong)(int)uVar15;
            if (*(char *)(lVar31 + 1 + uVar35) != '\0') goto LAB_001546a8;
LAB_001546ba:
            uVar12 = *(undefined4 *)(lVar30 + -8 + uVar35 * 4);
            goto LAB_001546bf;
          }
          if (*(char *)(lVar31 + 3 + (long)iVar14) == '\0') goto LAB_00154b2e;
          if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_00151c5d;
LAB_00154ade:
          uVar35 = (ulong)(int)uVar15;
          if (*(char *)(lVar18 + uVar35) == '\0') {
            uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + uVar35 * 4),*(uint *)(lVar27 + uVar35 * 4)
                                 );
            *(uint *)(lVar30 + uVar35 * 4) = uVar15;
            goto LAB_001546c8;
          }
        }
        uVar12 = *(undefined4 *)(lVar27 + uVar35 * 4);
LAB_001546b4:
        *(undefined4 *)(lVar30 + uVar35 * 4) = uVar12;
        goto LAB_001546c8;
      }
      if (uVar2 == 2) {
        uVar35 = 0;
        uVar15 = 0;
        if (cVar1 == '\0') {
LAB_001521ce:
          uVar15 = (uint)uVar35;
          uVar32 = (ulong)(int)uVar15;
          if (*(char *)(lVar11 + uVar32) == '\0') {
LAB_00154987:
            uVar35 = (ulong)uVar15;
LAB_0015498f:
            uVar15 = (uint)uVar35;
            if (*(char *)(lVar24 + 1 + (long)(int)uVar15) != '\0') goto LAB_00151ba4;
LAB_001549a0:
            uVar32 = (ulong)(int)uVar15;
            if (*(char *)(lVar11 + 1 + uVar32) == '\0') {
              *(undefined4 *)(lVar30 + uVar32 * 4) = 0;
              goto LAB_001546c8;
            }
          }
          else if (*(char *)(lVar24 + 1 + uVar32) != '\0') goto LAB_00151ba4;
LAB_001549aa:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar15 = RemSP::length_ + 1;
          *(uint *)(lVar30 + uVar32 * 4) = RemSP::length_;
          RemSP::length_ = uVar15;
        }
        else {
LAB_00151ba4:
          uVar35 = (ulong)(int)uVar15;
          uVar19 = (ulong)uVar15;
          if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_00151c50;
LAB_00151c5d:
          uVar12 = *(undefined4 *)(lVar27 + uVar35 * 4);
LAB_001546bf:
          *(undefined4 *)(lVar30 + uVar35 * 4) = uVar12;
        }
      }
      else {
        uVar35 = 0;
        uVar19 = 0;
        if (cVar1 == '\0') {
LAB_00152149:
          uVar35 = (ulong)(int)uVar35;
          if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0015474e:
            *(undefined4 *)(lVar30 + uVar35 * 4) = 0;
            goto LAB_001546c8;
          }
        }
        else {
LAB_00151c50:
          uVar35 = (ulong)(int)uVar19;
          if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_00151c5d;
        }
LAB_00152156:
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar15 = RemSP::length_ + 1;
        *(uint *)(lVar30 + uVar35 * 4) = RemSP::length_;
        RemSP::length_ = uVar15;
      }
LAB_001546c8:
      uVar34 = uVar34 + 2;
      lVar37 = lVar37 + 2;
      lVar38 = lVar38 + 2;
      lVar48 = lVar48 + 2;
    } while (uVar34 < uVar46);
  }
  if ((uVar16 & 0x80000001) != 1) goto LAB_00155fad;
  uVar35 = (ulong)(uVar16 - 1);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar38 = *(long *)&pMVar3->field_0x10;
  lVar37 = **(long **)&pMVar3->field_0x48;
  lVar45 = lVar38 + lVar37 * uVar35;
  lVar49 = lVar45 - lVar37;
  lVar24 = *(long *)&pMVar4->field_0x10;
  lVar11 = **(long **)&pMVar4->field_0x48;
  lVar48 = lVar24 + lVar11 * uVar35;
  lVar33 = lVar48 + lVar11 * -2;
  uVar34 = 0;
  if (2 < (int)uVar2) {
    lVar30 = lVar49 - lVar37;
    lVar31 = (long)local_190;
    lVar40 = lVar11 * uVar35 + lVar24 + 8;
    lVar36 = (uVar35 - 1) * lVar37;
    lVar27 = lVar36 + lVar38 + 4;
    lVar43 = lVar37 * uVar35 + lVar38 + 3;
    lVar37 = lVar37 * (uVar35 - 2) + lVar38 + 3;
    lVar24 = lVar11 * (uVar35 - 2) + lVar24 + 0x10;
    iVar14 = -2;
    uVar34 = 0;
    do {
      lVar11 = (long)(int)uVar34;
      uVar35 = uVar34;
      if (*(char *)(lVar45 + lVar11) == '\0') goto LAB_00155028;
      if (*(char *)((long)iVar14 + 3 + lVar49) != '\0') {
        *(undefined4 *)(lVar48 + lVar11 * 4) = *(undefined4 *)(lVar33 + lVar11 * 4);
        goto LAB_00155894;
      }
      if (*(char *)(lVar45 + 3 + (long)iVar14) != '\0') {
LAB_00155041:
        uVar34 = (ulong)(int)uVar35;
        if (*(char *)(lVar49 + 2 + uVar34) != '\0') {
          if (*(char *)(lVar49 + uVar34) != '\0') goto LAB_00155057;
          goto LAB_0015534a;
        }
        if (*(char *)(lVar49 + uVar34) == '\0') goto LAB_00155358;
LAB_0015507c:
        *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + uVar34 * 4);
        lVar11 = (long)(int)uVar35;
        uVar34 = lVar11 + 2;
        if ((int)uVar34 < local_190) {
          uVar35 = uVar34;
          if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_00155302;
          if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
            if (*(char *)(lVar30 + uVar34) == '\0') {
              uVar15 = RemSP::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),
                                    *(uint *)(lVar48 + lVar11 * 4));
              *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
              goto LAB_00155894;
            }
LAB_001556e8:
            lVar11 = (long)(int)uVar34;
            if (*(char *)(lVar30 + -1 + lVar11) != '\0') goto LAB_00155a03;
            uVar15 = RemSP::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),*(uint *)(lVar33 + lVar11 * 4)
                                 );
            goto LAB_00155a4c;
          }
          if (*(char *)(lVar45 + 3 + lVar11) != '\0') {
            if (*(char *)(lVar11 + 4 + lVar49) == '\0') {
              *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = *(undefined4 *)(lVar48 + lVar11 * 4);
              goto LAB_00155603;
            }
            if ((*(char *)(lVar30 + 3 + lVar11) == '\0') || (*(char *)(lVar30 + uVar34) == '\0')) {
              uVar15 = RemSP::Merge(*(uint *)(lVar33 + 0x10 + lVar11 * 4),
                                    *(uint *)(lVar48 + lVar11 * 4));
              *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
              goto LAB_001553f1;
            }
LAB_00155790:
            lVar11 = (long)(int)uVar34;
            uVar35 = uVar34;
            if (*(char *)(lVar30 + -1 + lVar11) != '\0') goto LAB_0015506a;
            uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
            uVar6 = *(uint *)(lVar48 + -8 + lVar11 * 4);
LAB_00155148:
            uVar15 = RemSP::Merge(uVar15,uVar6);
            do {
              *(uint *)(lVar48 + lVar11 * 4) = uVar15;
              uVar34 = uVar35;
LAB_001553f1:
              iVar14 = (int)uVar34;
              uVar15 = iVar14 + 2;
              if (local_190 <= (int)uVar15) {
LAB_00155c66:
                if (local_190 < (int)uVar15) {
                  uVar34 = (ulong)uVar15;
                  goto LAB_00155dc4;
                }
                lVar38 = (long)(int)uVar15;
                lVar37 = (long)iVar14;
                if (*(char *)(lVar45 + lVar38) == '\0') {
                  if (*(char *)(lVar45 + 3 + lVar37) == '\0') goto LAB_00155f08;
                  goto LAB_00155efa;
                }
                if (*(char *)(lVar49 + 3 + lVar37) != '\0') goto LAB_00155efa;
LAB_00155ccc:
                uVar12 = *(undefined4 *)(lVar48 + lVar37 * 4);
                goto LAB_00155eff;
              }
              lVar29 = (long)iVar14;
              lVar25 = lVar29 << 0x20;
              lVar11 = lVar40 + lVar29 * 4;
              lVar47 = lVar27 + lVar29;
              lVar18 = lVar24 + lVar29 * 4;
              lVar26 = 0;
              while (*(char *)(lVar43 + lVar29 + -1 + lVar26) != '\0') {
                iVar41 = (int)lVar26;
                if (*(char *)(lVar47 + -1 + lVar26) != '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar18 + -8 + lVar26 * 4);
                  goto LAB_00155894;
                }
                if (*(char *)(lVar43 + lVar29 + lVar26) == '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar48 + (lVar25 >> 0x1e));
                  goto LAB_00155b2b;
                }
                if (*(char *)(lVar47 + lVar26) == '\0') {
                  uVar34 = (ulong)(iVar14 + iVar41 + 2);
                  *(undefined4 *)(lVar11 + lVar26 * 4) = *(undefined4 *)(lVar48 + (lVar25 >> 0x1e));
                  goto LAB_00155603;
                }
                uVar15 = *(uint *)(lVar18 + lVar26 * 4);
                if (*(char *)(lVar37 + lVar29 + lVar26) == '\0') {
                  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar11 + -8 + lVar26 * 4));
                }
                *(uint *)(lVar11 + lVar26 * 4) = uVar15;
                lVar25 = lVar25 + 0x200000000;
                lVar8 = lVar29 + lVar26;
                lVar26 = lVar26 + 2;
                if (lVar31 <= lVar8 + 4) {
                  uVar15 = iVar14 + (int)lVar26 + 2;
                  iVar14 = iVar14 + (int)lVar26;
                  goto LAB_00155c66;
                }
              }
              uVar35 = (uVar34 & 0xffffffff) + lVar26 + 2;
              iVar14 = (int)uVar35;
              lVar11 = lVar25 + 0x300000000 >> 0x20;
              uVar34 = lVar29 + 2 + lVar26;
              if (*(char *)(lVar45 + lVar11) == '\0') goto LAB_0015518a;
              if (*(char *)(lVar49 + lVar11) != '\0') {
LAB_00155317:
                do {
                  *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + uVar34 * 4);
                  uVar34 = (long)(int)uVar35 + 2;
                  if (local_190 <= (int)uVar34) {
                    if (local_190 < (int)uVar34) goto LAB_00155dc4;
                    if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_00155edc;
LAB_00155c93:
                    lVar38 = (long)(int)uVar34;
                    if (*(char *)(lVar49 + 1 + lVar38) == '\0') {
                      uVar15 = *(uint *)(lVar48 + -8 + lVar38 * 4);
                    }
                    else if (*(char *)(lVar49 + lVar38) == '\0') {
                      uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                      if (*(char *)(lVar30 + lVar38) != '\0') {
                        *(uint *)(lVar48 + lVar38 * 4) = uVar15;
                        goto LAB_00155fad;
                      }
                      uVar6 = *(uint *)(lVar48 + -8 + lVar38 * 4);
LAB_00155fa4:
                      uVar15 = RemSP::Merge(uVar15,uVar6);
                    }
                    else {
LAB_00155cac:
                      uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                    }
LAB_00155fa9:
                    *(uint *)(lVar48 + lVar38 * 4) = uVar15;
                    goto LAB_00155fad;
                  }
                  uVar35 = uVar34;
                  if (*(char *)(lVar45 + uVar34) != '\0') goto LAB_00155932;
LAB_00155028:
                  iVar14 = (int)uVar35;
                  uVar34 = (ulong)iVar14;
                  if (*(char *)(uVar34 + 1 + lVar45) == '\0') {
                    while( true ) {
                      uVar34 = (ulong)iVar14;
LAB_0015518a:
                      *(undefined4 *)(lVar48 + uVar34 * 4) = 0;
                      lVar11 = (long)iVar14;
                      uVar34 = lVar11 + 2;
                      if (local_190 <= (int)uVar34) break;
                      uVar35 = uVar34;
                      if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_00155028;
                      if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
                        if ((*(char *)(lVar49 + uVar34) == '\0') &&
                           (*(char *)(lVar49 + 1 + lVar11) != '\0')) goto LAB_001559f5;
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                             *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                        goto LAB_00155894;
                      }
                      if (*(char *)(lVar45 + 3 + lVar11) == '\0') {
                        if (*(char *)(lVar49 + uVar34) == '\0') {
                          if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar15 = RemSP::length_ + 1;
                            *(uint *)(lVar48 + 8 + lVar11 * 4) = RemSP::length_;
                            RemSP::length_ = uVar15;
                            goto LAB_00155b2b;
                          }
                          uVar12 = *(undefined4 *)(lVar33 + lVar11 * 4);
                        }
                        else {
                          uVar12 = *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                        }
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = uVar12;
                        goto LAB_00155b2b;
                      }
                      cVar1 = *(char *)(lVar11 + 2 + lVar49);
                      if (*(char *)(lVar11 + 4 + lVar49) != '\0') {
                        if (cVar1 != '\0') goto LAB_00155057;
                        if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                               *(undefined4 *)(lVar33 + 0x10 + lVar11 * 4);
                        }
                        else {
LAB_001559c4:
                          lVar11 = (long)(int)uVar34;
                          if ((*(char *)(lVar30 + 1 + lVar11) == '\0') ||
                             (*(char *)(lVar30 + lVar11) == '\0')) {
                            uVar15 = RemSP::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),
                                                  *(uint *)(lVar33 + 8 + lVar11 * 4));
                          }
                          else {
                            uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                          }
                          *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                        }
                        goto LAB_001553f1;
                      }
                      if (cVar1 != '\0') goto LAB_0015507c;
                      if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar15 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                      }
                      else {
                        uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                      }
LAB_00155292:
                      *(uint *)(lVar48 + uVar34 * 4) = uVar15;
                      lVar11 = (long)(int)uVar35;
                      uVar34 = lVar11 + 2;
                      if (local_190 <= (int)uVar34) {
                        if (local_190 < (int)uVar34) goto LAB_00155dc4;
                        if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_00155d01;
                        if (*(char *)(lVar49 + 3 + lVar11) == '\0') goto LAB_00155f7d;
                        goto LAB_00155e9d;
                      }
                      uVar35 = uVar34;
                      if (*(char *)(lVar45 + uVar34) != '\0') {
                        if (*(char *)(lVar11 + 3 + lVar49) != '\0') {
                          uVar15 = RemSP::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),
                                                *(uint *)(lVar48 + lVar11 * 4));
                          *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
                          goto LAB_00155894;
                        }
                        if (*(char *)(lVar45 + 3 + lVar11) == '\0') {
                          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                               *(undefined4 *)(lVar48 + lVar11 * 4);
                          goto LAB_00155b2b;
                        }
                        if (*(char *)(lVar11 + 4 + lVar49) != '\0') {
                          uVar15 = RemSP::Merge(*(uint *)(lVar33 + 0x10 + lVar11 * 4),
                                                *(uint *)(lVar48 + lVar11 * 4));
                          *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
                          goto LAB_001553f1;
                        }
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) =
                             *(undefined4 *)(lVar48 + lVar11 * 4);
LAB_00155603:
                        while( true ) {
                          iVar14 = (int)uVar34;
                          uVar15 = iVar14 + 2;
                          if (local_190 <= (int)uVar15) break;
                          lVar25 = (long)iVar14;
                          lVar11 = lVar25 + 2;
                          lVar29 = lVar25 << 0x20;
                          lVar47 = lVar40 + lVar25 * 4;
                          lVar18 = lVar27 + lVar25;
                          lVar26 = 0;
                          while( true ) {
                            if (*(char *)(lVar43 + lVar25 + -1 + lVar26) == '\0') {
                              uVar35 = (ulong)(uint)((int)lVar11 + (int)lVar26);
                              goto LAB_00155302;
                            }
                            lVar9 = lVar29 >> 0x20;
                            lVar8 = lVar29 >> 0x1e;
                            if (*(char *)(lVar18 + -1 + lVar26) != '\0') break;
                            if (*(char *)(lVar43 + lVar25 + lVar26) == '\0') {
                              *(undefined4 *)(lVar47 + lVar26 * 4) = *(undefined4 *)(lVar48 + lVar8)
                              ;
                              uVar34 = (ulong)(uint)((int)lVar11 + (int)lVar26);
                              goto LAB_00155b2b;
                            }
                            if (*(char *)(lVar18 + lVar26) != '\0') {
                              if (*(char *)(lVar26 + lVar37 + lVar25) == '\0') {
                                uVar15 = RemSP::Merge(*(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4),
                                                      *(uint *)(lVar48 + lVar8));
                                *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                              }
                              else {
                                if (*(char *)(lVar26 + -1 + lVar37 + lVar25) == '\0') {
                                  uVar15 = *(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4);
                                  uVar6 = *(uint *)(lVar48 + lVar8);
                                }
                                else {
                                  if (*(char *)(lVar49 + lVar9) != '\0') {
                                    uVar34 = lVar11 + lVar26 & 0xffffffff;
                                    goto LAB_00155790;
                                  }
                                  uVar15 = *(uint *)(lVar24 + lVar25 * 4 + lVar26 * 4);
                                  uVar6 = *(uint *)(lVar48 + lVar9 * 4);
                                }
                                uVar15 = RemSP::Merge(uVar15,uVar6);
                                *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                              }
                              uVar34 = lVar11 + lVar26 & 0xffffffff;
                              goto LAB_001553f1;
                            }
                            *(undefined4 *)(lVar47 + lVar26 * 4) =
                                 *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
                            lVar29 = lVar29 + 0x200000000;
                            lVar8 = lVar26 + lVar11;
                            lVar26 = lVar26 + 2;
                            if (lVar31 <= lVar8 + 2) {
                              uVar15 = iVar14 + (int)lVar26 + 2;
                              iVar14 = iVar14 + (int)lVar26;
                              goto LAB_00155bd6;
                            }
                          }
                          if (*(char *)(lVar26 + -1 + lVar37 + lVar25) == '\0') {
                            uVar15 = *(uint *)(lVar24 + lVar25 * 4 + -8 + lVar26 * 4);
                            uVar6 = *(uint *)(lVar48 + lVar8);
                          }
                          else {
                            if (*(char *)(lVar49 + lVar9) != '\0') {
                              uVar34 = lVar11 + lVar26 & 0xffffffff;
                              goto LAB_001556e8;
                            }
                            uVar15 = *(uint *)(lVar24 + lVar25 * 4 + -8 + lVar26 * 4);
                            uVar6 = *(uint *)(lVar48 + lVar9 * 4);
                          }
                          uVar15 = RemSP::Merge(uVar15,uVar6);
                          *(uint *)(lVar47 + lVar26 * 4) = uVar15;
                          uVar34 = lVar11 + lVar26 & 0xffffffff;
LAB_00155894:
                          iVar14 = (int)uVar34;
                          uVar15 = iVar14 + 2;
                          if (local_190 <= (int)uVar15) {
LAB_00155b9f:
                            uVar34 = (ulong)uVar15;
                            lVar38 = (long)(int)uVar15;
                            if (local_190 < (int)uVar15) {
                              if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00155f08;
                              lVar37 = (long)iVar14;
                              if (*(char *)(lVar45 + 1 + lVar37) != '\0') goto LAB_00155ccc;
                            }
                            else {
                              if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00155edc;
                              if (*(char *)(lVar45 + 1 + (long)iVar14) != '\0') goto LAB_00155c93;
                              if (*(char *)(lVar49 + 3 + (long)iVar14) != '\0') {
                                if (*(char *)(lVar49 + lVar38) == '\0') goto LAB_00155dfb;
                                goto LAB_00155efa;
                              }
                            }
                            if (*(char *)(lVar49 + lVar38) != '\0') goto LAB_00155efa;
                            uVar12 = *(undefined4 *)(lVar33 + (long)iVar14 * 4);
                            goto LAB_00155eff;
                          }
                          lVar25 = (long)iVar14;
                          lVar11 = lVar25 + 2;
                          lVar47 = lVar24 + lVar25 * 4;
                          lVar18 = lVar38 + lVar36 + 2 + lVar25;
                          lVar29 = lVar43 + lVar25;
                          lVar25 = lVar40 + lVar25 * 4;
                          lVar26 = 0;
LAB_001558db:
                          iVar41 = (int)lVar11;
                          iVar13 = (int)lVar26;
                          if (*(char *)(lVar29 + -1 + lVar26) == '\0') {
                            uVar35 = (ulong)(uint)(iVar41 + iVar13);
                            goto LAB_00155028;
                          }
                          if (*(char *)(lVar29 + -2 + lVar26) == '\0') {
                            if (*(char *)(lVar18 + 1 + lVar26) == '\0') {
                              uVar34 = lVar11 + lVar26;
                              if (*(char *)(lVar26 + lVar29) == '\0') {
                                if (*(char *)(lVar26 + lVar18) == '\0') {
                                  uVar12 = *(undefined4 *)(lVar47 + -0x10 + lVar26 * 4);
                                }
                                else {
                                  uVar12 = *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
                                }
                                *(undefined4 *)(lVar25 + lVar26 * 4) = uVar12;
                                uVar34 = uVar34 & 0xffffffff;
                                goto LAB_00155b2b;
                              }
                              if (*(char *)(lVar26 + 2 + lVar18) != '\0') {
                                uVar34 = uVar34 & 0xffffffff;
                                uVar35 = uVar34;
                                if (*(char *)(lVar26 + lVar18) == '\0') goto LAB_001559c4;
                                goto LAB_00155057;
                              }
                              if (*(char *)(lVar26 + lVar18) == '\0') {
                                uVar35 = uVar34 & 0xffffffff;
                                uVar15 = *(uint *)(lVar47 + -0x10 + lVar26 * 4);
                                goto LAB_00155292;
                              }
                              uVar35 = uVar34 & 0xffffffff;
                              goto LAB_0015507c;
                            }
                            if (*(char *)(lVar18 + lVar26) != '\0') goto code_r0x00155900;
                            uVar34 = (ulong)(uint)(iVar41 + iVar13);
LAB_001559f5:
                            lVar11 = (long)(int)uVar34;
                            if (*(char *)(lVar30 + lVar11) == '\0') {
                              uVar15 = RemSP::Merge(*(uint *)(lVar33 + -8 + lVar11 * 4),
                                                    *(uint *)(lVar33 + lVar11 * 4));
                            }
                            else {
LAB_00155a03:
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                            }
LAB_00155a4c:
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_00155894;
                          }
                          uVar34 = (ulong)(uint)(iVar41 + iVar13);
LAB_00155932:
                          lVar11 = (long)(int)uVar34;
                          if (*(char *)(lVar11 + 1 + lVar49) != '\0') {
                            if (*(char *)(lVar49 + lVar11) == '\0') {
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                              if (*(char *)(lVar30 + lVar11) != '\0') {
                                *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                                goto LAB_00155894;
                              }
                              uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar48 + -8 + lVar11 * 4));
                            }
                            else {
                              uVar15 = *(uint *)(lVar33 + lVar11 * 4);
                            }
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_00155894;
                          }
                          if (*(char *)(lVar45 + 1 + lVar11) == '\0') {
                            *(undefined4 *)(lVar48 + lVar11 * 4) =
                                 *(undefined4 *)(lVar48 + -8 + lVar11 * 4);
                            goto LAB_00155b2b;
                          }
                          if (*(char *)(lVar11 + 2 + lVar49) != '\0') {
                            if (*(char *)(lVar30 + 1 + lVar11) == '\0') {
                              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
LAB_00155acc:
                              uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar48 + -8 + lVar11 * 4));
                            }
                            else {
                              if (*(char *)(lVar49 + lVar11) == '\0') {
                                uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                                if (*(char *)(lVar30 + lVar11) == '\0') goto LAB_00155acc;
                                *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                                goto LAB_001553f1;
                              }
                              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
                            }
                            *(uint *)(lVar48 + lVar11 * 4) = uVar15;
                            goto LAB_001553f1;
                          }
                          *(undefined4 *)(lVar48 + lVar11 * 4) =
                               *(undefined4 *)(lVar48 + -8 + lVar11 * 4);
                        }
LAB_00155bd6:
                        uVar34 = (ulong)uVar15;
                        if (local_190 < (int)uVar15) goto LAB_00155dc4;
                        lVar38 = (long)(int)uVar15;
                        if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00155d01;
                        lVar45 = (long)iVar14;
                        if (*(char *)(lVar49 + 3 + lVar45) == '\0') {
                          uVar15 = *(uint *)(lVar48 + lVar45 * 4);
                          goto LAB_00155fa9;
                        }
                        if (*(char *)(lVar30 + lVar38) == '\0') {
                          uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                          uVar6 = *(uint *)(lVar48 + lVar45 * 4);
                          goto LAB_00155fa4;
                        }
                        if (*(char *)(lVar49 + lVar45) != '\0') goto LAB_00155c25;
                        uVar15 = *(uint *)(lVar33 + lVar38 * 4);
                        uVar6 = *(uint *)(lVar48 + lVar45 * 4);
                        goto LAB_00155f72;
                      }
LAB_00155302:
                      iVar14 = (int)uVar35;
                      uVar34 = (ulong)iVar14;
                      if (*(char *)(uVar34 + 1 + lVar45) != '\0') {
                        if (*(char *)(lVar49 + 1 + uVar34) != '\0') goto LAB_00155317;
                        uVar34 = (ulong)iVar14;
                        if (*(char *)(uVar34 + 2 + lVar49) != '\0') goto LAB_0015534a;
LAB_00155358:
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar15 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                        goto LAB_00155292;
                      }
                    }
                    if (local_190 < (int)uVar34) {
                      if (*(char *)(lVar45 + uVar34) == '\0') {
                        *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = 0;
                        goto LAB_00155fad;
                      }
LAB_00155f38:
                      if (*(char *)(lVar49 + uVar34) != '\0') goto LAB_00155f40;
                      if (*(char *)(lVar49 + 1 + lVar11) == '\0') {
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar15 = RemSP::length_ + 1;
                        *(uint *)(lVar48 + 8 + lVar11 * 4) = RemSP::length_;
                        RemSP::length_ = uVar15;
                        goto LAB_00155fad;
                      }
                      uVar12 = *(undefined4 *)(lVar33 + lVar11 * 4);
                    }
                    else {
                      if (*(char *)(lVar45 + uVar34) == '\0') goto LAB_00155edc;
                      if (*(char *)(lVar49 + 3 + lVar11) == '\0') goto LAB_00155f38;
                      if ((*(char *)(lVar49 + uVar34) == '\0') &&
                         (*(char *)(lVar49 + 1 + lVar11) != '\0')) {
LAB_00155dfb:
                        lVar38 = (long)(int)uVar34;
                        if (*(char *)(lVar30 + lVar38) != '\0') goto LAB_00155cac;
                        uVar15 = *(uint *)(lVar33 + -8 + lVar38 * 4);
                        uVar6 = *(uint *)(lVar33 + lVar38 * 4);
                        goto LAB_00155fa4;
                      }
LAB_00155f40:
                      uVar12 = *(undefined4 *)(lVar33 + 8 + lVar11 * 4);
                    }
                    *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = uVar12;
                    goto LAB_00155fad;
                  }
                } while (*(char *)(lVar49 + 1 + uVar34) != '\0');
                goto LAB_00155041;
              }
              if (*(char *)(lVar49 + 4 + (lVar25 >> 0x20)) == '\0') goto LAB_0015507c;
LAB_00155057:
              lVar11 = (long)(int)uVar35;
              if (*(char *)(lVar30 + 1 + lVar11) == '\0') goto LAB_0015513e;
LAB_0015506a:
              uVar15 = *(uint *)(lVar33 + 8 + lVar11 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar48 + 8 + lVar11 * 4) = *(undefined4 *)(lVar48 + lVar11 * 4);
          goto LAB_00155b2b;
        }
        if (local_190 < (int)uVar34) {
LAB_00155dc4:
          lVar38 = (long)(int)uVar34;
          if (*(char *)(lVar45 + lVar38) == '\0') goto LAB_00155f08;
          uVar12 = *(undefined4 *)(lVar48 + -8 + lVar38 * 4);
          goto LAB_00155eff;
        }
        if (*(char *)(lVar45 + uVar34) == '\0') {
LAB_00155d01:
          lVar38 = (long)(int)uVar34;
          if (*(char *)(lVar38 + 1 + lVar45) == '\0') {
            *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
            goto LAB_00155fad;
          }
          cVar1 = *(char *)(lVar49 + 1 + lVar38);
          goto joined_r0x00155d19;
        }
        if (*(char *)(lVar49 + 3 + lVar11) == '\0') {
LAB_00155f7d:
          uVar15 = *(uint *)(lVar48 + lVar11 * 4);
        }
        else {
          if (*(char *)(lVar30 + uVar34) != '\0') {
LAB_00155c25:
            lVar38 = (long)(int)uVar34;
            if (*(char *)(lVar30 + -1 + lVar38) == '\0') {
              uVar15 = *(uint *)(lVar33 + -8 + lVar38 * 4);
              uVar6 = *(uint *)(lVar33 + lVar38 * 4);
LAB_00155f72:
              uVar15 = RemSP::Merge(uVar15,uVar6);
            }
            else {
              uVar15 = *(uint *)(lVar33 + lVar38 * 4);
            }
            *(uint *)(lVar48 + lVar38 * 4) = uVar15;
            goto LAB_00155fad;
          }
LAB_00155e9d:
          uVar15 = RemSP::Merge(*(uint *)(lVar33 + 8 + lVar11 * 4),*(uint *)(lVar48 + lVar11 * 4));
        }
        *(uint *)(lVar48 + 8 + lVar11 * 4) = uVar15;
        goto LAB_00155fad;
      }
      if (*(char *)(lVar49 + lVar11) == '\0') {
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar15 = RemSP::length_ + 1;
        *(uint *)(lVar48 + lVar11 * 4) = RemSP::length_;
        RemSP::length_ = uVar15;
      }
      else {
        *(undefined4 *)(lVar48 + lVar11 * 4) = *(undefined4 *)(lVar33 + lVar11 * 4);
      }
LAB_00155b2b:
      iVar14 = (int)uVar34;
      uVar34 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_190);
  }
  iVar14 = (int)uVar34;
  lVar38 = (long)iVar14;
  if (local_190 < iVar14) {
    if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_00155f08:
      *(undefined4 *)(lVar48 + lVar38 * 4) = 0;
      goto LAB_00155fad;
    }
LAB_00155ef0:
    lVar38 = (long)iVar14;
    cVar1 = *(char *)(lVar49 + lVar38);
joined_r0x00155d19:
    if (cVar1 == '\0') {
      RemSP::P_[RemSP::length_] = RemSP::length_;
      uVar15 = RemSP::length_ + 1;
      *(uint *)(lVar48 + lVar38 * 4) = RemSP::length_;
      RemSP::length_ = uVar15;
      goto LAB_00155fad;
    }
  }
  else {
    if (*(char *)(lVar45 + lVar38) == '\0') {
LAB_00155edc:
      iVar14 = (int)uVar34;
      lVar38 = (long)iVar14;
      if (*(char *)(lVar45 + 1 + lVar38) == '\0') goto LAB_00155f08;
    }
    lVar38 = (long)iVar14;
    if (*(char *)(lVar49 + 1 + lVar38) == '\0') goto LAB_00155ef0;
  }
LAB_00155efa:
  uVar12 = *(undefined4 *)(lVar33 + lVar38 * 4);
LAB_00155eff:
  *(undefined4 *)(lVar48 + lVar38 * 4) = uVar12;
LAB_00155fad:
  puVar7 = RemSP::P_;
  uVar15 = 1;
  if (1 < RemSP::length_) {
    uVar15 = 1;
    uVar34 = 1;
    do {
      if (puVar7[uVar34] < uVar34) {
        puVar7[uVar34] = puVar7[puVar7[uVar34]];
      }
      else {
        puVar7[uVar34] = uVar15;
        uVar15 = uVar15 + 1;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
  puVar7 = RemSP::P_;
  uVar34 = 0;
  iVar14 = (int)(uVar17 & 0xfffffffffffffffe);
  if (0 < (int)uVar46) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar37 = *(long *)&pMVar3->field_0x10;
    lVar24 = **(long **)&pMVar3->field_0x48;
    lVar11 = *(long *)&pMVar4->field_0x10;
    lVar49 = **(long **)&pMVar4->field_0x48;
    lVar38 = lVar11 + lVar49;
    lVar48 = lVar37 + 1 + lVar24;
    lVar45 = lVar37 + 1;
    uVar34 = 0;
    lVar33 = lVar11;
    do {
      puVar5 = RemSP::P_;
      lVar40 = lVar49 * uVar34 + lVar11;
      lVar43 = lVar40 + lVar49;
      if (iVar14 < 1) {
        uVar35 = 0;
      }
      else {
        uVar35 = 0;
        do {
          lVar36 = (long)*(int *)(lVar33 + uVar35 * 4);
          if (lVar36 < 1) {
            *(undefined8 *)(lVar33 + uVar35 * 4) = 0;
            uVar32 = uVar35 + 1;
            *(undefined4 *)(lVar38 + uVar35 * 4) = 0;
            uVar15 = 0;
          }
          else {
            uVar15 = puVar5[lVar36];
            uVar6 = uVar15;
            if (*(char *)(lVar45 + -1 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar33 + uVar35 * 4) = uVar6;
            uVar32 = uVar35 | 1;
            uVar6 = uVar15;
            if (*(char *)(lVar45 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar33 + 4 + uVar35 * 4) = uVar6;
            uVar6 = uVar15;
            if (*(char *)(lVar48 + -1 + uVar35) == '\0') {
              uVar6 = 0;
            }
            *(uint *)(lVar38 + uVar35 * 4) = uVar6;
            if (*(char *)(lVar48 + uVar35) == '\0') {
              uVar15 = 0;
            }
          }
          *(uint *)(lVar43 + uVar32 * 4) = uVar15;
          uVar35 = uVar35 + 2;
        } while ((long)uVar35 < (long)(uVar17 & 0xfffffffffffffffe));
      }
      if ((uVar2 & 0x80000001) == 1) {
        lVar36 = (long)*(int *)(lVar40 + uVar35 * 4);
        if (lVar36 < 1) {
          *(undefined4 *)(lVar40 + uVar35 * 4) = 0;
          *(undefined4 *)(lVar43 + uVar35 * 4) = 0;
        }
        else {
          lVar30 = lVar24 * uVar34 + lVar37;
          uVar15 = puVar7[lVar36];
          uVar6 = uVar15;
          if (*(char *)(lVar30 + uVar35) == '\0') {
            uVar6 = 0;
          }
          *(uint *)(lVar40 + uVar35 * 4) = uVar6;
          if (*(char *)(lVar30 + lVar24 + uVar35) == '\0') {
            *(undefined4 *)(lVar43 + uVar35 * 4) = 0;
          }
          else {
            *(uint *)(lVar43 + uVar35 * 4) = uVar15;
          }
        }
      }
      uVar34 = uVar34 + 2;
      lVar38 = lVar38 + lVar49 * 2;
      lVar48 = lVar48 + lVar24 * 2;
      lVar45 = lVar45 + lVar24 * 2;
      lVar33 = lVar33 + lVar49 * 2;
    } while (uVar34 < uVar46);
    uVar34 = uVar34 & 0xffffffff;
  }
  puVar7 = RemSP::P_;
  if ((uVar16 & 0x80000001) == 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar45 = *(long *)&pMVar3->field_0x10;
    lVar37 = **(long **)&pMVar3->field_0x48 * uVar34;
    lVar48 = *(long *)&pMVar4->field_0x10;
    lVar38 = uVar34 * **(long **)&pMVar4->field_0x48;
    if (iVar14 < 1) {
      uVar34 = 0;
    }
    else {
      lVar24 = lVar37 + lVar45;
      lVar11 = lVar38 + lVar48;
      uVar34 = 0;
      do {
        lVar49 = (long)*(int *)(lVar11 + uVar34 * 4);
        if (lVar49 < 1) {
          *(undefined8 *)(lVar11 + uVar34 * 4) = 0;
        }
        else {
          uVar16 = puVar7[lVar49];
          uVar46 = uVar16;
          if (*(char *)(lVar24 + uVar34) == '\0') {
            uVar46 = 0;
          }
          *(uint *)(lVar11 + uVar34 * 4) = uVar46;
          if (*(char *)(lVar24 + 1 + uVar34) == '\0') {
            *(undefined4 *)(lVar11 + 4 + uVar34 * 4) = 0;
          }
          else {
            *(uint *)(lVar11 + 4 + uVar34 * 4) = uVar16;
          }
        }
        uVar34 = uVar34 + 2;
      } while (uVar34 < (uVar17 & 0xfffffffe));
    }
    if ((uVar2 & 0x80000001) == 1) {
      lVar48 = lVar48 + lVar38;
      lVar38 = (long)*(int *)(lVar48 + uVar34 * 4);
      uVar16 = 0;
      if ((0 < lVar38) && (uVar16 = 0, *(char *)(lVar45 + lVar37 + uVar34) != '\0')) {
        uVar16 = RemSP::P_[lVar38];
      }
      *(uint *)(lVar48 + uVar34 * 4) = uVar16;
    }
  }
  if (RemSP::P_ != (uint *)0x0) {
    operator_delete__(RemSP::P_);
  }
  return;
LAB_00151693:
  uVar12 = 0;
LAB_001516a8:
  *(undefined4 *)(lVar48 + lVar38 * 4) = uVar12;
  uVar6 = uVar15;
LAB_001516ac:
  uVar15 = uVar6 + 2;
  if (iVar14 <= (int)uVar15) goto LAB_001516bb;
  goto LAB_001515fd;
LAB_00153494:
  *(undefined4 *)(lVar29 + lVar43 + 8 + lVar10 * 4) = *(undefined4 *)(lVar30 + lVar39);
  uVar35 = (ulong)(uint)(iVar13 + iVar41);
LAB_00153624:
  iVar14 = (int)uVar35;
  uVar15 = iVar14 + 2;
  if ((int)uVar15 < local_190) {
    lVar8 = (long)iVar14;
    lVar29 = lVar8 + 2;
    lVar26 = lVar8 << 0x20;
    lVar25 = lVar36 + lVar8 * 4;
    lVar9 = lVar43 + lVar25 + 8;
    lVar10 = lVar47 + lVar8 + lVar49;
    lVar20 = lVar10 + 3;
    lVar21 = lVar33 * lVar37 + lVar8 + lVar49;
    lVar28 = 0;
    do {
      iVar41 = (int)lVar29;
      lVar39 = lVar26 >> 0x20;
      lVar42 = lVar26 >> 0x1e;
      iVar13 = (int)lVar28;
      if (*(char *)(lVar10 + 2 + lVar28) == '\0') {
        if (*(char *)(lVar33 * lVar48 + lVar8 + lVar49 + 2 + lVar28) == '\0') {
          uVar35 = (ulong)(uint)(iVar41 + iVar13);
          goto LAB_0015315a;
        }
        if (*(char *)(lVar20 + lVar28) == '\0') {
          uVar35 = (ulong)(uint)(iVar41 + iVar13);
          *(undefined4 *)(lVar25 + lVar43 + 8 + lVar28 * 4) = *(undefined4 *)(lVar30 + lVar42);
          goto LAB_0015266a;
        }
        if (*(char *)(lVar21 + 3 + lVar28) != '\0') {
          uVar35 = lVar29 + lVar28;
          if (*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) == '\0') {
            uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                  *(uint *)(lVar30 + lVar42));
          }
          else {
            if (*(char *)(lVar31 + lVar39) != '\0') goto LAB_00153a3a;
            uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                  *(uint *)(lVar30 + lVar39 * 4));
          }
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
          goto LAB_00153c89;
        }
      }
      else {
        if (*(char *)(lVar21 + 3 + lVar28) != '\0') {
          uVar35 = lVar29 + lVar28;
          if (*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) == '\0') {
            uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                  *(uint *)(lVar30 + lVar42));
          }
          else {
            if (*(char *)(lVar31 + lVar39) != '\0') goto LAB_00151dee;
            uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 8 + lVar28 * 4),
                                  *(uint *)(lVar30 + lVar39 * 4));
          }
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
          goto LAB_001544fe;
        }
        if (*(char *)(lVar20 + lVar28) == '\0') goto LAB_00153894;
      }
      if (*(char *)(lVar21 + 4 + lVar28) != '\0') {
        uVar32 = lVar29 + lVar28;
        if (*(char *)(lVar18 + 3 + lVar39) == '\0') {
          uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 0x10 + lVar28 * 4),
                                *(uint *)(lVar30 + lVar39 * 4));
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
        }
        else {
          if ((*(char *)(lVar28 + 2 + lVar33 * lVar38 + lVar8 + lVar49) != '\0') &&
             (*(char *)(lVar31 + lVar39) != '\0')) goto LAB_0015381d;
          uVar15 = RemSP::Merge(*(uint *)(lVar40 * lVar38 + lVar8 * 4 + lVar43 + 0x10 + lVar28 * 4),
                                *(uint *)(lVar30 + lVar39 * 4));
          *(uint *)(lVar9 + lVar28 * 4) = uVar15;
        }
        uVar35 = uVar32 & 0xffffffff;
        goto LAB_0015320c;
      }
      *(undefined4 *)(lVar9 + lVar28 * 4) = *(undefined4 *)(lVar43 + lVar25 + lVar28 * 4);
      lVar26 = lVar26 + 0x200000000;
      lVar39 = lVar29 + lVar28;
      lVar28 = lVar28 + 2;
      if (lVar45 <= lVar39 + 2) {
        iVar14 = iVar14 + (int)lVar28;
        uVar15 = iVar41 + (int)lVar28;
        break;
      }
    } while( true );
  }
  uVar35 = (ulong)uVar15;
  uVar32 = uVar35;
  if (local_190 < (int)uVar15) goto LAB_00153cc9;
  lVar49 = (long)iVar14;
  if (*(char *)(lVar24 + uVar35) == '\0') {
    if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0015394d;
    if (*(char *)(lVar24 + 3 + lVar49) != '\0') goto LAB_0015376b;
  }
  else {
LAB_0015376b:
    if (*(char *)(lVar31 + 3 + lVar49) != '\0') {
      uVar19 = uVar35;
      if (*(char *)(lVar18 + uVar35) == '\0') {
        uVar15 = *(uint *)(lVar27 + uVar35 * 4);
        uVar6 = *(uint *)(lVar30 + lVar49 * 4);
      }
      else {
LAB_00153fbb:
        uVar35 = (ulong)(int)uVar19;
        if (*(char *)((uVar35 - 2) + lVar31) != '\0') goto LAB_00153fc5;
        uVar15 = *(uint *)(lVar27 + uVar35 * 4);
        uVar6 = *(uint *)(lVar30 + -8 + uVar35 * 4);
      }
      uVar15 = RemSP::Merge(uVar15,uVar6);
      *(uint *)(lVar30 + uVar35 * 4) = uVar15;
      goto LAB_001546c8;
    }
  }
  uVar12 = *(undefined4 *)(lVar30 + lVar49 * 4);
  goto LAB_001546b4;
LAB_00153894:
  uVar15 = iVar41 + iVar13;
  *(undefined4 *)(lVar25 + lVar43 + 8 + lVar28 * 4) = *(undefined4 *)(lVar30 + lVar42);
LAB_001538c8:
  uVar35 = (ulong)uVar15;
LAB_00153dcd:
  do {
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    uVar15 = (uint)uVar35;
    if (local_190 <= (int)uVar15) {
      uVar32 = uVar35 & 0xffffffff;
      if (local_190 < (int)uVar15) {
        if (*(char *)(lVar24 + uVar32) == '\0') {
LAB_0015408e:
          iVar14 = (int)uVar35;
          uVar35 = uVar35 & 0xffffffff;
          if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_0015474e;
LAB_0015409b:
          uVar35 = (ulong)iVar14;
          if (*(char *)(lVar11 + -1 + uVar35) == '\0') goto LAB_00152156;
          goto LAB_001546ba;
        }
        uVar19 = uVar35;
        if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151c50;
      }
      else {
        if (*(char *)(lVar24 + uVar32) == '\0') {
          if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0015498f;
          if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
LAB_001540ce:
            iVar14 = (int)uVar35;
            goto LAB_0015409b;
          }
        }
        if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151ba4;
        if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
          if (*(char *)(lVar31 + lVar29) == '\0') goto LAB_00153021;
LAB_00153eb4:
          uVar15 = (uint)uVar35;
          if (*(char *)(lVar18 + -1 + (long)(int)uVar15) != '\0') goto LAB_001546a8;
          uVar35 = uVar35 & 0xffffffff;
          uVar6 = *(uint *)(lVar27 + uVar35 * 4);
          uVar15 = *(uint *)(lVar30 + -8 + (long)(int)uVar15 * 4);
LAB_001528e2:
          uVar15 = RemSP::Merge(uVar6,uVar15);
          *(uint *)(lVar30 + uVar35 * 4) = uVar15;
          goto LAB_001546c8;
        }
      }
      uVar19 = uVar35;
      if (*(char *)(lVar31 + uVar32) != '\0') goto LAB_00153fbb;
      goto LAB_00153fe5;
    }
    if (*(char *)(lVar24 + uVar35) == '\0') {
      if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_00154181:
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_00151d40;
      }
      uVar32 = uVar35;
      if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0015261e;
      if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151d51;
      if (*(char *)(lVar31 + 3 + lVar29) != '\0') {
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_00153f41;
        uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_00153c89;
      }
    }
    else {
      uVar32 = uVar35;
      if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151beb;
      if (*(char *)(lVar29 + 3 + lVar31) != '\0') {
        if (*(char *)(lVar31 + lVar29) == '\0') goto LAB_0015239e;
LAB_00153e0e:
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
          uVar15 = *(uint *)(lVar27 + lVar29 * 4);
          goto LAB_00153e24;
        }
LAB_00153d3c:
        lVar29 = (long)(int)uVar35;
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_0015492c;
        uVar15 = *(uint *)(lVar27 + lVar29 * 4);
        if (*(char *)(lVar18 + lVar29) == '\0') goto LAB_00153e24;
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        goto LAB_001544fe;
      }
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        if (*(char *)(lVar31 + uVar35) == '\0') goto LAB_001541c9;
        if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_001541ae;
        uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_00152dca;
      }
    }
    if (*(char *)(lVar29 + 4 + lVar31) != '\0') {
      if (*(char *)(lVar18 + 3 + lVar29) == '\0') {
        if (*(char *)(lVar31 + uVar35) != '\0') {
          if (*(char *)(lVar31 + lVar29) == '\0') {
            uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                  *(uint *)(lVar27 + 0x10 + lVar29 * 4));
            uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + lVar29 * 4));
LAB_001544ec:
            *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
            uVar35 = uVar35 & 0xffffffff;
          }
          else {
LAB_001542cb:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                    *(uint *)(lVar27 + 8 + lVar29 * 4));
              uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
            }
            else {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                    *(uint *)(lVar30 + -8 + lVar29 * 4));
            }
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
          }
          goto LAB_0015320c;
        }
      }
      else if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_00154105:
        iVar14 = (int)uVar35;
        uVar35 = uVar35 & 0xffffffff;
        lVar29 = (long)iVar14;
        if (*(char *)(lVar18 + -1 + lVar29) != '\0') goto LAB_00153d96;
        uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
        goto LAB_0015411f;
      }
      uVar15 = RemSP::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
      *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
      goto LAB_0015320c;
    }
    if (*(char *)(lVar31 + 2 + lVar29) != '\0') {
      uVar32 = uVar35;
      if (*(char *)(lVar31 + lVar29) == '\0') {
        uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
      }
      else {
LAB_001541f0:
        uVar35 = uVar32 & 0xffffffff;
        lVar29 = (long)(int)uVar32;
        uVar15 = *(uint *)(lVar27 + lVar29 * 4);
        if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
          uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        }
        else {
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
        }
      }
      goto LAB_00151db9;
    }
LAB_0015420b:
    *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
    uVar35 = uVar35 & 0xffffffff;
LAB_00152f85:
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    if (local_190 <= (int)uVar35) {
      uVar32 = uVar35;
      if (local_190 < (int)uVar35) goto LAB_00153cc9;
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar24 + uVar32) == '\0') {
        if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0015394d;
        if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_00153fe5;
      }
      if (*(char *)(lVar31 + 3 + lVar29) == '\0') goto LAB_00153fe5;
      goto LAB_00153021;
    }
    if (*(char *)(lVar24 + uVar35) != '\0') {
      if (*(char *)(lVar29 + 3 + lVar31) != '\0') {
        uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        goto LAB_001544fe;
      }
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_00153dcd;
      }
LAB_001530d8:
      if (*(char *)(lVar29 + 4 + lVar31) != '\0') {
        uVar15 = RemSP::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
        *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
        uVar35 = uVar35 & 0xffffffff;
        goto LAB_0015320c;
      }
      *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_00153624;
    }
    if (*(char *)(lVar11 + uVar35) == '\0') {
LAB_0015315a:
      iVar14 = (int)uVar35;
      lVar29 = (long)iVar14;
      if (*(char *)(lVar29 + 1 + lVar24) == '\0') goto LAB_00152050;
      if (*(char *)(lVar31 + 1 + lVar29) != '\0') goto LAB_00151d5b;
      if (*(char *)(lVar29 + 2 + lVar31) == '\0') break;
      *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + 8 + lVar29 * 4);
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_0015320c;
    }
    if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0015313f;
    if (*(char *)(lVar31 + 3 + lVar29) == '\0') goto LAB_001530d8;
    uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + lVar29 * 4));
    *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
LAB_00153c89:
    lVar29 = (long)(int)uVar35;
    uVar35 = lVar29 + 2;
    if (local_190 <= (int)uVar35) {
      if (local_190 < (int)uVar35) {
        uVar32 = uVar35 & 0xffffffff;
        goto LAB_00153cc9;
      }
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar24 + uVar32) != '\0') goto LAB_0015469e;
      if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_00154981;
      if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_0015469e;
      *(undefined4 *)(lVar30 + uVar32 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
      goto LAB_001546c8;
    }
    if (*(char *)(lVar24 + uVar35) == '\0') {
      if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_00151d40;
      if (*(char *)(lVar24 + 3 + lVar29) == '\0') {
        *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
LAB_0015266a:
        lVar29 = (long)(int)uVar35;
        uVar35 = lVar29 + 2;
        if ((int)uVar35 < local_190) {
          if (*(char *)(lVar24 + uVar35) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0015245d;
          }
          if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00152262;
LAB_001526ba:
          lVar29 = (long)(int)uVar35;
          if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
            if (*(char *)(lVar31 + lVar29) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                      *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar29) == '\0') {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                        *(uint *)(lVar27 + lVar29 * 4));
                  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                else {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                        *(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            else {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                    *(uint *)(lVar30 + -8 + lVar29 * 4));
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            }
            goto LAB_001544fe;
          }
          if (*(char *)(lVar24 + 1 + lVar29) == '\0') {
            if (*(char *)(lVar31 + -1 + lVar29) != '\0') {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                    *(uint *)(lVar30 + -8 + lVar29 * 4));
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              goto LAB_00153dcd;
            }
LAB_00152ba9:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar31 + lVar29) == '\0') {
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
              goto LAB_0015236c;
            }
            uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4)
                                 );
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
LAB_00152dca:
            lVar29 = (long)(int)uVar35;
            uVar35 = lVar29 + 2;
            uVar15 = (uint)uVar35;
            if (local_190 <= (int)uVar15) {
              uVar32 = uVar35 & 0xffffffff;
              if (local_190 < (int)uVar15) {
                if (*(char *)(lVar24 + uVar32) == '\0') goto LAB_0015408e;
                uVar19 = uVar35;
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151c50;
              }
              else {
                if (*(char *)(lVar24 + uVar32) == '\0') {
                  if (*(char *)(lVar11 + uVar32) == '\0') goto LAB_0015498f;
                  if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_001540ce;
                }
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151ba4;
                if (*(char *)(lVar31 + 3 + lVar29) != '\0') goto LAB_00153eb4;
              }
              uVar19 = uVar35;
              if (*(char *)(lVar31 + uVar32) != '\0') goto LAB_00153fc5;
              uVar12 = *(undefined4 *)(lVar30 + lVar29 * 4);
              goto LAB_0015348b;
            }
            if (*(char *)(lVar24 + uVar35) == '\0') {
              if (*(char *)(lVar11 + uVar35) == '\0') goto LAB_00154181;
              uVar32 = uVar35;
              if (*(char *)(lVar29 + 3 + lVar24) == '\0') goto LAB_0015261e;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151d51;
              if (*(char *)(lVar31 + 3 + lVar29) != '\0') goto LAB_00153f41;
LAB_00152ec9:
              if (*(char *)(lVar29 + 4 + lVar31) == '\0') {
                uVar32 = uVar35;
                if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_001541f0;
                goto LAB_0015420b;
              }
              if (*(char *)(lVar18 + 3 + lVar29) != '\0') goto LAB_00154105;
              if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_001542cb;
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + 0x10 + lVar29 * 4),
                                    *(uint *)(lVar30 + lVar29 * 4));
              goto LAB_001544ec;
            }
            uVar32 = uVar35;
            if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151beb;
            if (*(char *)(lVar29 + 3 + lVar31) != '\0') goto LAB_00153e0e;
            if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_00152ec9;
            if (*(char *)(lVar31 + uVar35) != '\0') {
LAB_001541ae:
              lVar29 = (long)(int)uVar35;
              uVar15 = *(uint *)(lVar27 + lVar29 * 4);
              if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              goto LAB_00152dca;
            }
LAB_001541c9:
            *(undefined4 *)(lVar30 + 8 + lVar29 * 4) = *(undefined4 *)(lVar30 + lVar29 * 4);
LAB_0015236c:
            lVar29 = (long)(int)uVar35;
            uVar35 = lVar29 + 2;
            if (local_190 <= (int)uVar35) {
              cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
              uVar32 = uVar35;
              if ((int)uVar35 <= local_190) {
                if (cVar1 == '\0') goto LAB_00152892;
                goto LAB_001528ad;
              }
              if (cVar1 == '\0') goto LAB_0015408e;
              uVar19 = uVar35;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151c50;
              goto LAB_001528ce;
            }
            if (*(char *)(lVar24 + uVar35) != '\0') {
              uVar32 = uVar35;
              if (*(char *)(lVar11 + 1 + lVar29) == '\0') goto LAB_00151beb;
              if (*(char *)(lVar29 + 3 + lVar31) != '\0') goto LAB_0015239e;
              if (*(char *)(lVar24 + 3 + lVar29) == '\0') goto LAB_00152ba9;
LAB_001524e5:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar29 + 2 + lVar31) == '\0') {
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_0015254e;
              }
              if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                if (*(char *)(lVar31 + lVar29) == '\0') {
                  uVar6 = *(uint *)(lVar27 + 8 + lVar29 * 4);
                  uVar15 = *(uint *)(lVar30 + -8 + lVar29 * 4);
                }
                else {
                  uVar6 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                       *(uint *)(lVar27 + 8 + lVar29 * 4));
                  uVar15 = *(uint *)(lVar30 + -8 + lVar29 * 4);
                }
                uVar15 = RemSP::Merge(uVar6,uVar15);
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
              else {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                      *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
                uVar35 = uVar35 & 0xffffffff;
              }
              goto LAB_0015320c;
            }
LAB_0015245d:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar11 + lVar29) != '\0') {
              uVar32 = uVar35;
              if (*(char *)(lVar24 + 1 + lVar29) == '\0') goto LAB_0015261e;
              if (*(char *)(lVar11 + -1 + lVar29) == '\0') goto LAB_00151d51;
LAB_00152478:
              lVar29 = (long)(int)uVar32;
              uVar35 = uVar32;
              if (*(char *)(lVar31 + 1 + lVar29) == '\0') goto LAB_001524e5;
              goto LAB_00152487;
            }
            uVar35 = uVar35 & 0xffffffff;
LAB_00151d40:
            while( true ) {
              while( true ) {
                iVar14 = (int)uVar35;
                uVar35 = uVar35 & 0xffffffff;
                if (*(char *)(lVar24 + 1 + (long)iVar14) != '\0') goto LAB_00151d51;
LAB_00152050:
                lVar29 = (long)iVar14;
                if (*(char *)(lVar11 + 1 + lVar29) == '\0') break;
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar15 = RemSP::length_;
                uVar6 = RemSP::length_ + 1;
                *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
                RemSP::length_ = uVar6;
                uVar32 = lVar29 + 2;
                if (local_190 <= (int)uVar32) {
                  uVar19 = uVar32 & 0xffffffff;
                  if (local_190 < (int)uVar32) {
                    if (*(char *)(lVar24 + uVar19) == '\0') goto LAB_00153cd6;
                    goto LAB_001527ce;
                  }
                  if (*(char *)(lVar24 + uVar19) != '\0') {
                    uVar35 = uVar32 & 0xffffffff;
                    goto LAB_0015277b;
                  }
                  uVar35 = uVar32;
                  if (*(char *)(lVar11 + uVar19) == '\0') goto LAB_0015498f;
                  if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_001528c1;
                  *(uint *)(lVar30 + uVar19 * 4) = uVar15;
                  goto LAB_001546c8;
                }
                if (*(char *)(lVar24 + uVar32) != '\0') {
                  uVar35 = uVar32 & 0xffffffff;
                  goto LAB_001526ba;
                }
                if (*(char *)(lVar11 + uVar32) != '\0') {
                  if (*(char *)(lVar24 + 3 + lVar29) != '\0') goto LAB_00152478;
                  *(uint *)(lVar30 + 8 + lVar29 * 4) = uVar15;
                  uVar35 = uVar32 & 0xffffffff;
                  goto LAB_0015266a;
                }
                uVar35 = uVar32 & 0xffffffff;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = 0;
              uVar35 = lVar29 + 2;
              if (local_190 <= (int)uVar35) {
                cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
                uVar19 = uVar35;
                if ((int)uVar35 <= local_190) {
                  if (cVar1 != '\0') goto LAB_00152857;
                  goto LAB_001521ce;
                }
                if (cVar1 != '\0') goto LAB_00152a0b;
                goto LAB_00152149;
              }
              if (*(char *)(lVar24 + uVar35) != '\0') break;
LAB_00151cc9:
              lVar29 = (long)(int)uVar35;
              if (*(char *)(lVar11 + lVar29) != '\0') {
                if (*(char *)(lVar24 + 1 + lVar29) != '\0') goto LAB_00151d51;
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar15 = RemSP::length_ + 1;
                *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
                RemSP::length_ = uVar15;
                goto LAB_0015266a;
              }
            }
LAB_00152262:
            lVar29 = (long)(int)uVar35;
            if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
              if ((*(char *)(lVar31 + lVar29) == '\0') && (*(char *)(lVar31 + -1 + lVar29) != '\0'))
              goto LAB_0015491e;
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
              goto LAB_001544fe;
            }
            if (*(char *)(lVar24 + 1 + lVar29) == '\0') {
              if (*(char *)(lVar31 + lVar29) == '\0') {
                if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar15 = RemSP::length_ + 1;
                  *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
                  RemSP::length_ = uVar15;
                }
                else {
                  *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + -8 + lVar29 * 4);
                }
                goto LAB_0015236c;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
              goto LAB_00152dca;
            }
            if (*(char *)(lVar31 + 2 + lVar29) == '\0') {
              if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_00151dad;
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar15 = RemSP::length_;
                goto LAB_00151ee0;
              }
              *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + -8 + lVar29 * 4);
              goto LAB_00152f85;
            }
            if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_00151d89;
            if (*(char *)(lVar31 + -1 + lVar29) == '\0') goto LAB_001522dd;
LAB_00154cac:
            lVar29 = (long)(int)uVar35;
            if ((*(char *)(lVar18 + 1 + lVar29) == '\0') || (*(char *)(lVar18 + lVar29) == '\0')) {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                    *(uint *)(lVar27 + 8 + lVar29 * 4));
            }
            else {
              uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
            }
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            goto LAB_0015320c;
          }
          if (*(char *)(lVar29 + 2 + lVar31) != '\0') {
            if (*(char *)(lVar31 + lVar29) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                      *(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                      *(uint *)(lVar27 + 8 + lVar29 * 4));
                uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar29) == '\0') {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                        *(uint *)(lVar27 + 8 + lVar29 * 4));
                  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                else {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                        *(uint *)(lVar30 + -8 + lVar29 * 4));
                }
                *(uint *)(lVar30 + lVar29 * 4) = uVar15;
              }
            }
            else {
              if (*(char *)(lVar18 + 1 + lVar29) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),
                                      *(uint *)(lVar27 + 8 + lVar29 * 4));
                uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
              }
              else {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),
                                      *(uint *)(lVar30 + -8 + lVar29 * 4));
              }
              *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            }
            goto LAB_0015320c;
          }
          if (*(char *)(lVar31 + -1 + lVar29) != '\0') {
            uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar29 * 4),
                                  *(uint *)(lVar30 + -8 + lVar29 * 4));
            *(uint *)(lVar30 + lVar29 * 4) = uVar15;
            goto LAB_00153624;
          }
LAB_0015254e:
          lVar29 = (long)(int)uVar35;
          if (*(char *)(lVar31 + lVar29) == '\0') {
            *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
            goto LAB_00152f85;
          }
          uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
          *(uint *)(lVar30 + lVar29 * 4) = uVar15;
          goto LAB_00151db9;
        }
        cVar1 = *(char *)(lVar24 + (uVar35 & 0xffffffff));
        uVar19 = uVar35;
        if (local_190 < (int)uVar35) {
          if (cVar1 == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0015408e;
          }
          uVar32 = uVar35 & 0xffffffff;
          if (*(char *)(lVar11 + 1 + lVar29) == '\0') {
LAB_00152a0b:
            uVar35 = (ulong)(int)uVar19;
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_00151c5d;
            if (*(char *)(lVar31 + -1 + uVar35) == '\0') goto LAB_00152156;
            uVar12 = *(undefined4 *)(lVar27 + -8 + uVar35 * 4);
            goto LAB_001546bf;
          }
LAB_001527ce:
          uVar35 = (ulong)(int)uVar32;
          if (*(char *)(lVar31 + -1 + uVar35) == '\0') {
LAB_001528ce:
            uVar35 = (ulong)(int)uVar32;
            if (*(char *)(lVar31 + uVar35) != '\0') goto LAB_001528d7;
            uVar12 = *(undefined4 *)(lVar30 + -8 + uVar35 * 4);
            goto LAB_001546b4;
          }
          uVar6 = *(uint *)(lVar27 + -8 + uVar35 * 4);
        }
        else {
          if (cVar1 != '\0') {
            if (*(char *)(lVar11 + 1 + lVar29) == '\0') {
LAB_00152857:
              uVar15 = (uint)uVar19;
              uVar35 = (ulong)(int)uVar15;
              if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_00152a0b;
              if ((*(char *)(lVar31 + uVar35) != '\0') || (*(char *)(lVar31 + -1 + uVar35) == '\0'))
              goto LAB_00151c5d;
              goto LAB_00154ade;
            }
LAB_0015277b:
            lVar24 = (long)(int)uVar35;
            uVar32 = uVar35 & 0xffffffff;
            if (*(char *)(lVar31 + 1 + lVar24) == '\0') goto LAB_001527ce;
            if (*(char *)(lVar31 + lVar24) == '\0') {
              if (*(char *)(lVar31 + -1 + lVar24) == '\0') {
                uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar24 * 4),
                                      *(uint *)(lVar30 + -8 + lVar24 * 4));
                *(uint *)(lVar30 + lVar24 * 4) = uVar15;
              }
              else {
                if (*(char *)(lVar18 + lVar24) == '\0') {
                  uVar15 = RemSP::Merge(*(uint *)(lVar27 + -8 + lVar24 * 4),
                                        *(uint *)(lVar27 + lVar24 * 4));
                  uVar6 = *(uint *)(lVar30 + -8 + lVar24 * 4);
                }
                else {
                  uVar15 = *(uint *)(lVar27 + lVar24 * 4);
                  uVar6 = *(uint *)(lVar30 + -8 + lVar24 * 4);
                }
                uVar15 = RemSP::Merge(uVar15,uVar6);
                *(uint *)(lVar30 + lVar24 * 4) = uVar15;
              }
            }
            else {
              uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar24 * 4),
                                    *(uint *)(lVar30 + -8 + lVar24 * 4));
              *(uint *)(lVar30 + lVar24 * 4) = uVar15;
            }
            goto LAB_001546c8;
          }
          uVar35 = uVar35 & 0xffffffff;
LAB_00152892:
          iVar14 = (int)uVar35;
          if (*(char *)(lVar11 + (uVar35 & 0xffffffff)) == '\0') goto LAB_0015498f;
          uVar32 = uVar35;
          if (*(char *)(lVar24 + 1 + (long)iVar14) == '\0') goto LAB_0015409b;
LAB_001528ad:
          uVar15 = (uint)uVar32;
          if (*(char *)(lVar11 + -1 + (long)(int)uVar15) == '\0') goto LAB_00151ba4;
LAB_001528c1:
          uVar35 = (ulong)(int)uVar32;
          if (*(char *)(lVar31 + 1 + uVar35) == '\0') goto LAB_001528ce;
LAB_001528d7:
          uVar6 = *(uint *)(lVar27 + uVar35 * 4);
        }
        uVar15 = *(uint *)(lVar30 + -8 + uVar35 * 4);
        goto LAB_001528e2;
      }
LAB_00154853:
      uVar32 = uVar35 & 0xffffffff;
      if (*(char *)(lVar31 + 1 + (long)(int)uVar35) != '\0') goto LAB_00154864;
      goto LAB_00153d6b;
    }
LAB_00153d2a:
    lVar29 = (long)(int)uVar35;
    if (*(char *)(lVar29 + 1 + lVar31) != '\0') {
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_00153d3c;
    }
    if (*(char *)(lVar24 + 1 + lVar29) != '\0') {
LAB_00153d6b:
      lVar29 = (long)(int)uVar35;
      if (*(char *)(lVar31 + 2 + lVar29) != '\0') goto LAB_00153d7e;
      *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
      goto LAB_00153624;
    }
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
  } while( true );
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar15 = RemSP::length_ + 1;
  *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
  RemSP::length_ = uVar15;
  uVar35 = uVar35 & 0xffffffff;
  goto LAB_00152f85;
LAB_00153f41:
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar18 + -1 + lVar29) == '\0') {
LAB_00152487:
    uVar15 = RemSP::Merge(*(uint *)(lVar27 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
    uVar35 = uVar32;
  }
  else {
LAB_00154864:
    uVar35 = uVar32;
    lVar29 = (long)(int)uVar35;
    if (*(char *)(lVar31 + lVar29) == '\0') {
      uVar15 = *(uint *)(lVar27 + lVar29 * 4);
      if (*(char *)(lVar18 + lVar29) == '\0') {
        uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
      }
      else {
        *(uint *)(lVar30 + lVar29 * 4) = uVar15;
      }
      goto LAB_00153c89;
    }
    uVar15 = *(uint *)(lVar27 + lVar29 * 4);
  }
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_00153c89;
LAB_0015261e:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar11 + -1 + lVar29) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar15 = RemSP::length_ + 1;
    *(uint *)(lVar30 + lVar29 * 4) = RemSP::length_;
    RemSP::length_ = uVar15;
  }
  else {
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar30 + -8 + lVar29 * 4);
  }
  goto LAB_0015266a;
LAB_00151d51:
  lVar29 = (long)(int)uVar35;
  uVar32 = uVar35;
  if (*(char *)(lVar31 + 1 + lVar29) == '\0') goto LAB_00151d6f;
LAB_00151d5b:
  *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
  goto LAB_00153c89;
LAB_00151d6f:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  if (*(char *)(lVar31 + 2 + lVar29) != '\0') {
    if (*(char *)(lVar31 + lVar29) != '\0') goto LAB_00151d89;
LAB_001522dd:
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + 8 + lVar29 * 4);
    goto LAB_0015320c;
  }
  if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_00151dad:
    *(undefined4 *)(lVar30 + lVar29 * 4) = *(undefined4 *)(lVar27 + lVar29 * 4);
    goto LAB_00151db9;
  }
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar15 = RemSP::length_;
LAB_00151ee0:
  RemSP::length_ = uVar15 + 1;
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_00152f85;
LAB_00153d7e:
  lVar29 = (long)(int)uVar35;
  if (*(char *)(lVar18 + 1 + lVar29) != '\0') goto LAB_00153d96;
  uVar15 = RemSP::Merge(*(uint *)(lVar27 + 8 + lVar29 * 4),*(uint *)(lVar30 + -8 + lVar29 * 4));
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0015320c;
LAB_00153d96:
  lVar29 = (long)(int)uVar35;
  if (*(char *)(lVar31 + lVar29) != '\0') {
LAB_00151d9c:
    uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
    goto LAB_0015415b;
  }
  cVar1 = *(char *)(lVar18 + lVar29);
  goto LAB_00153dac;
LAB_0015381d:
  uVar35 = uVar32 & 0xffffffff;
  lVar29 = (long)(int)uVar32;
  cVar1 = *(char *)(lVar18 + -1 + lVar29);
LAB_00153dac:
  uVar15 = *(uint *)(lVar27 + 8 + lVar29 * 4);
  if (cVar1 != '\0') {
    *(uint *)(lVar30 + lVar29 * 4) = uVar15;
    goto LAB_0015320c;
  }
LAB_0015411f:
  uVar15 = RemSP::Merge(uVar15,*(uint *)(lVar30 + -8 + lVar29 * 4));
LAB_0015415b:
  *(uint *)(lVar30 + lVar29 * 4) = uVar15;
  goto LAB_0015320c;
code_r0x00155900:
  *(undefined4 *)(lVar25 + lVar26 * 4) = *(undefined4 *)(lVar47 + -8 + lVar26 * 4);
  lVar8 = lVar11 + lVar26;
  lVar26 = lVar26 + 2;
  if (lVar31 <= lVar8 + 2) {
    uVar15 = iVar14 + (int)lVar26 + 2;
    iVar14 = iVar14 + (int)lVar26;
    goto LAB_00155b9f;
  }
  goto LAB_001558db;
LAB_0015534a:
  *(undefined4 *)(lVar48 + uVar34 * 4) = *(undefined4 *)(lVar33 + 8 + uVar34 * 4);
  uVar34 = uVar35;
  goto LAB_001553f1;
LAB_0015513e:
  uVar15 = *(uint *)(lVar33 + lVar11 * 4);
  uVar6 = *(uint *)(lVar33 + 8 + lVar11 * 4);
  goto LAB_00155148;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}